

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_scanl.c
# Opt level: O0

void set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double cx;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  *in_RDI->mix_coef = 1.0 - dVar1;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
set_ext_params(xc_func_type *p, const double *ext_params)
{
  const double *par_scan = NULL, *par_pc07 = NULL;
  if(ext_params != NULL) {
    par_scan = ext_params;
    par_pc07 = ext_params+4;
  }
  assert(p != NULL && p->func_aux != NULL);
  xc_func_set_ext_params(p->func_aux[0], par_scan);
  xc_func_set_ext_params(p->func_aux[1], par_pc07);
}